

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_createmem(size_t msize,int *handle)

{
  char *pcVar1;
  int local_24;
  int ii;
  int *handle_local;
  size_t msize_local;
  
  *handle = -1;
  local_24 = 0;
  do {
    if (9999 < local_24) {
LAB_0013952a:
      if (*handle == -1) {
        msize_local._4_4_ = 0x67;
      }
      else {
        memTable[local_24].memaddrptr = (char **)((long)local_24 * 0x48 + 0x30b3c8);
        memTable[local_24].memsizeptr = (size_t *)((long)local_24 * 0x48 + 0x30b3d8);
        if (msize != 0) {
          pcVar1 = (char *)malloc(msize);
          memTable[local_24].memaddr = pcVar1;
          if (memTable[local_24].memaddr == (char *)0x0) {
            ffpmsg("malloc of initial memory failed (mem_createmem)");
            return 0x68;
          }
        }
        memTable[local_24].memsize = msize;
        memTable[local_24].deltasize = 0xb40;
        memTable[local_24].fitsfilesize = 0;
        memTable[local_24].currentpos = 0;
        memTable[local_24].mem_realloc = realloc;
        msize_local._4_4_ = 0;
      }
      return msize_local._4_4_;
    }
    if (memTable[local_24].memaddrptr == (char **)0x0) {
      *handle = local_24;
      goto LAB_0013952a;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int mem_createmem(size_t msize, int *handle)
/* 
  lowest level routine to allocate a memory file.
*/
{
    int ii;

    *handle = -1;
    for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in handle table */
    {
        if (memTable[ii].memaddrptr == 0)
        {
            *handle = ii;
            break;
        }
    }
    if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

    /* use the internally allocated memaddr and memsize variables */
    memTable[ii].memaddrptr = &memTable[ii].memaddr;
    memTable[ii].memsizeptr = &memTable[ii].memsize;

    /* allocate initial block of memory for the file */
    if (msize > 0)
    {
        memTable[ii].memaddr = (char *) malloc(msize); 
        if ( !(memTable[ii].memaddr) )
        {
            ffpmsg("malloc of initial memory failed (mem_createmem)");
            return(FILE_NOT_OPENED);
        }
    }

    /* set initial state of the file */
    memTable[ii].memsize = msize;
    memTable[ii].deltasize = 2880;
    memTable[ii].fitsfilesize = 0;
    memTable[ii].currentpos = 0;
    memTable[ii].mem_realloc = realloc;
    return(0);
}